

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

char * __thiscall adios2sys::CommandLineArguments::GetHelp(CommandLineArguments *this,char *arg)

{
  char *pcVar1;
  bool bVar2;
  pointer ppVar3;
  char *in_RSI;
  iterator hit;
  CommandLineArgumentsCallbackStructure *cs;
  iterator it;
  iterator in_stack_ffffffffffffff18;
  _Self local_a0;
  allocator local_91;
  string local_90 [32];
  _Self local_70;
  CommandLineArgumentsCallbackStructure *local_68;
  _Self local_60 [3];
  allocator local_41;
  string local_40 [32];
  _Self local_20 [3];
  char *local_8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,in_RSI,&local_41);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
       ::find(in_stack_ffffffffffffff18._M_node,(key_type *)0xf42dca);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
       ::end(in_stack_ffffffffffffff18._M_node);
  bVar2 = std::operator==(local_20,local_60);
  if (bVar2) {
    local_8 = (char *)0x0;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>
                           *)0xf42e93);
    while( true ) {
      local_68 = &ppVar3->second;
      pcVar1 = (ppVar3->second).Help;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,&local_91);
      in_stack_ffffffffffffff18 =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
           ::find(in_stack_ffffffffffffff18._M_node,(key_type *)0xf42ef5);
      local_70._M_node = in_stack_ffffffffffffff18._M_node;
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>_>
           ::end(in_stack_ffffffffffffff18._M_node);
      bVar2 = std::operator==(&local_70,&local_a0);
      if (bVar2) break;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2sys::CommandLineArgumentsCallbackStructure>_>
                             *)0xf42f8f);
    }
    local_8 = local_68->Help;
  }
  return local_8;
}

Assistant:

const char* CommandLineArguments::GetHelp(const char* arg)
{
  auto it = this->Internals->Callbacks.find(arg);
  if (it == this->Internals->Callbacks.end()) {
    return nullptr;
  }

  // Since several arguments may point to the same argument, find the one this
  // one point to if this one is pointing to another argument.
  CommandLineArgumentsCallbackStructure* cs = &(it->second);
  for (;;) {
    auto hit = this->Internals->Callbacks.find(cs->Help);
    if (hit == this->Internals->Callbacks.end()) {
      break;
    }
    cs = &(hit->second);
  }
  return cs->Help;
}